

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GPUShaderFP64Test8::getGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test8 *this,_test_case *test_case)

{
  ostream *poVar1;
  char *this_00;
  stringstream result_sstream;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = 
  "#version 420\n\nlayout(points)                 in;\nlayout(max_vertices=1, points) out;\n\nvoid main()\n{\n"
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "#version 420\n\nlayout(points)                 in;\nlayout(max_vertices=1, points) out;\n\nvoid main()\n{\n"
             ,100);
  getGeneralBody_abi_cxx11_(&local_1c0,(GPUShaderFP64Test8 *)this_00,test_case);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test8::getGeometryShaderBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form the body */
	result_sstream << "#version 420\n"
					  "\n"
					  "layout(points)                 in;\n"
					  "layout(max_vertices=1, points) out;\n"
					  "\n"
					  "void main()\n"
					  "{\n"
				   << getGeneralBody(test_case) << "}\n"
												   "\n";

	/* We're done! */
	return result_sstream.str();
}